

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int executeExternalCommand
              (string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  long lVar4;
  undefined1 auVar5 [16];
  Optional<llvm::ArrayRef<llvm::StringRef>_> Env;
  undefined8 uVar6;
  NodeKind NVar7;
  Twine *pTVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  int iVar10;
  char *pcVar11;
  Child CVar12;
  void *in_RCX;
  Child CVar13;
  ulong in_R9;
  long lVar14;
  Child CVar15;
  StringRef SVar16;
  StringRef Name;
  ArrayRef<llvm::StringRef> Args;
  StringRef Program;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> argRefs;
  vector<char_*,_std::allocator<char_*>_> argsAsCStrings;
  SmallString<256U> SubcommandPath;
  undefined1 local_1f0 [16];
  Twine local_1e0;
  Child local_1c8;
  Twine *local_1c0;
  long local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198;
  uint7 uStack_197;
  fs *local_190 [2];
  long local_180 [2];
  Twine local_170;
  Twine local_158;
  SmallVectorImpl<char> local_140;
  undefined1 local_130 [256];
  
  pcVar1 = (command->_M_dataplus)._M_p;
  local_1b0 = args;
  local_190[0] = (fs *)local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,pcVar1,pcVar1 + command->_M_string_length);
  llvm::sys::fs::getMainExecutable_abi_cxx11_
            ((string *)local_1f0,local_190[0],(char *)getExecutablePath,in_RCX);
  SVar16.Length = 2;
  SVar16.Data = (char *)local_1f0._8_8_;
  SVar16 = llvm::sys::path::parent_path((path *)local_1f0._0_8_,SVar16,(Style)in_RCX);
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_130;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_140,SVar16.Data,SVar16.Data + SVar16.Length);
  if ((Twine *)local_1f0._0_8_ != &local_1e0) {
    operator_delete((void *)local_1f0._0_8_,(long)local_1e0.LHS + 1);
  }
  if (local_190[0] != (fs *)local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  llvm::Twine::Twine((Twine *)local_1f0,command);
  llvm::Twine::Twine((Twine *)&local_1c8,"");
  llvm::Twine::Twine(&local_170,"");
  llvm::Twine::Twine(&local_158,"");
  llvm::sys::path::append(&local_140,(Twine *)local_1f0,(Twine *)&local_1c8,&local_170,&local_158);
  llvm::Twine::Twine((Twine *)local_1f0,&local_140);
  iVar10 = llvm::sys::fs::access((char *)local_1f0,0);
  if (iVar10 != 0) {
    Name.Length = 0;
    Name.Data = (char *)command->_M_string_length;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = in_R9;
    llvm::sys::findProgramByName_abi_cxx11_
              ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1f0,(sys *)(command->_M_dataplus)._M_p,Name,
               (ArrayRef<llvm::StringRef>)(auVar5 << 0x40));
    NVar7 = local_1e0.LHSKind;
    if ((local_1e0.LHSKind & EmptyKind) == NullKind) {
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
      llvm::SmallVectorImpl<char>::append<char_const*,void>
                (&local_140,(char *)local_1f0._0_8_,(char *)(local_1f0._8_8_ + local_1f0._0_8_));
    }
    else {
      if (local_1f0._0_4_ == 0) {
        __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                      ,0xf4,
                      "storage_type *llvm::ErrorOr<std::basic_string<char>>::getStorage() [T = std::basic_string<char>]"
                     );
      }
      executeExternalCommand();
    }
    if (((local_1e0.LHSKind & EmptyKind) == NullKind) && ((Twine *)local_1f0._0_8_ != &local_1e0)) {
      operator_delete((void *)local_1f0._0_8_,(long)local_1e0.LHS + 1);
    }
    iVar10 = -1;
    if ((NVar7 & EmptyKind) != NullKind) goto LAB_0011861e;
  }
  pvVar9 = local_1b0;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1c8,
             (long)(local_1b0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1b0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_1f0);
  CVar13 = local_1c8;
  pbVar2 = (pvVar9->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (pvVar9->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar3) {
    lVar14 = 0;
    do {
      lVar4 = *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar14 * 4);
      local_1f0._0_8_ = &local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,lVar4,
                 *(long *)((long)&pbVar2->_M_string_length + lVar14 * 4) + lVar4);
      uVar6 = local_1f0._0_8_;
      pcVar11 = strdup((char *)local_1f0._0_8_);
      *(char **)((long)&(CVar13.twine)->LHS + lVar14) = pcVar11;
      if ((Twine *)uVar6 != &local_1e0) {
        operator_delete((void *)uVar6,(long)local_1e0.LHS + 1);
      }
      lVar4 = lVar14 * 4;
      lVar14 = lVar14 + 8;
    } while ((pointer)((long)&pbVar2[1]._M_dataplus._M_p + lVar4) != pbVar3);
  }
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_1f0,
             (long)local_1c0 - (long)local_1c8 >> 3,(allocator_type *)&local_170);
  pTVar8 = local_1c0;
  CVar13 = (Child)local_1f0._0_8_;
  for (CVar15 = local_1c8; CVar15.twine != pTVar8; CVar15.twine = (Twine *)&(CVar15.twine)->RHS) {
    pcVar11 = (CVar15.stringRef)->Data;
    if (pcVar11 == (char *)0x0) {
      CVar12.twine = (Twine *)0x0;
    }
    else {
      CVar12 = (Child)strlen(pcVar11);
    }
    ((Child *)&(CVar13.stringRef)->Data)->cString = pcVar11;
    *(Child *)&(CVar13.stdString)->_M_string_length = CVar12;
    CVar13.twine = (Twine *)&(CVar13.twine)->LHSKind;
  }
  Program.Length._0_4_ =
       local_140.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  Program.Data = (char *)local_140.super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  Args.Length = (long)(local_1f0._8_8_ - local_1f0._0_8_) >> 4;
  local_198 = 0;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[8] = (char)uStack_1a0;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[9] = (char)((ulong)uStack_1a0 >> 8);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[10] =
       (char)((ulong)uStack_1a0 >> 0x10);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xb] =
       (char)((ulong)uStack_1a0 >> 0x18);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xc] =
       (char)((ulong)uStack_1a0 >> 0x20);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xd] =
       (char)((ulong)uStack_1a0 >> 0x28);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xe] =
       (char)((ulong)uStack_1a0 >> 0x30);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xf] =
       (char)((ulong)uStack_1a0 >> 0x38);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0] = (char)local_1a8;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[1] = (char)((ulong)local_1a8 >> 8);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[2] = (char)((ulong)local_1a8 >> 0x10)
  ;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[3] = (char)((ulong)local_1a8 >> 0x18)
  ;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[4] = (char)((ulong)local_1a8 >> 0x20)
  ;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[5] = (char)((ulong)local_1a8 >> 0x28)
  ;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[6] = (char)((ulong)local_1a8 >> 0x30)
  ;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[7] = (char)((ulong)local_1a8 >> 0x38)
  ;
  Env.Storage._16_8_ = (ulong)uStack_197 << 8;
  Args.Data = (StringRef *)local_1f0._0_8_;
  Program.Length._4_4_ = 0;
  iVar10 = llvm::sys::ExecuteAndWait
                     (Program,Args,Env,(ArrayRef<llvm::Optional<llvm::StringRef>_>)ZEXT816(0),0,0,
                      (string *)0x0,(bool *)0x0);
  for (CVar13 = local_1c8; CVar13.twine != local_1c0; CVar13.twine = (Twine *)&(CVar13.twine)->RHS)
  {
    free(((Child *)&(CVar13.smallString)->super_SmallVectorTemplateBase<char,_true>)->twine);
  }
  if ((Twine *)local_1f0._0_8_ != (Twine *)0x0) {
    operator_delete((void *)local_1f0._0_8_,(long)local_1e0.LHS - local_1f0._0_8_);
  }
  if (local_1c8.twine != (Twine *)0x0) {
    operator_delete(local_1c8.twine,local_1b8 - (long)local_1c8);
  }
LAB_0011861e:
  if ((undefined1 *)
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_130) {
    free(local_140.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return iVar10;
}

Assistant:

int executeExternalCommand(std::string command, std::vector<std::string> args) {
  // We are running as a subcommand, try to find the subcommand adjacent to
  // the executable we are running as.
  SmallString<256> SubcommandPath(
                                  llvm::sys::path::parent_path(getExecutablePath(command)));
  llvm::sys::path::append(SubcommandPath, command);
  
  // If we didn't find the tool there, let the OS search for it.
  if (!llvm::sys::fs::exists(SubcommandPath)) {
    // Search for the program and use the path if found.
    auto result = llvm::sys::findProgramByName(command);
    if (!result.getError()) {
      SubcommandPath = *result;
    } else {
      fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
              command.c_str());
      return -1;
    }
  }
  
  std::vector<char*> argsAsCStrings(args.size());
  std::transform(args.begin(), args.end(), argsAsCStrings.begin(), [](std::string element) { return strdup(element.c_str()); });
  std::vector<StringRef> argRefs(argsAsCStrings.size());
  std::transform(argsAsCStrings.begin(), argsAsCStrings.end(), argRefs.begin(), [](char *element) { return StringRef(element); });
  // Actually execute the command and wait for it to finish
  int exitStatus = llvm::sys::ExecuteAndWait(StringRef(SubcommandPath), ArrayRef<StringRef>(argRefs));
  
  for (auto cString: argsAsCStrings) {
    free(cString);
  }
  
  return exitStatus;
}